

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_focus.cpp
# Opt level: O2

void __thiscall
r_exec::AutoFocusController::inject_input(AutoFocusController *this,View *input,uint64_t start)

{
  pointer ppGVar1;
  Group *this_00;
  uint32_t uVar2;
  View *this_01;
  long lVar3;
  _Mem *this_02;
  ulong uVar4;
  float fVar5;
  Atom local_54 [4];
  Group *local_50;
  View *local_48;
  double local_40;
  double local_38;
  
  local_48 = input;
  local_50 = View::get_host(input);
  while( true ) {
    uVar4 = start & 0xffff;
    ppGVar1 = (this->output_groups).
              super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->output_groups).
                      super__Vector_base<r_exec::Group_*,_std::allocator<r_exec::Group_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3) <= uVar4) break;
    this_00 = ppGVar1[uVar4];
    this_01 = (View *)operator_new(0x100);
    View::View(this_01,local_48,true);
    (this_01->super_View).references[0] = (Code *)this_00;
    fVar5 = (float)r_code::Atom::asFloat();
    local_38 = (double)fVar5;
    uVar2 = Group::get_upr(local_50);
    local_40 = (double)uVar2;
    uVar2 = Group::get_upr(this_00);
    lVar3 = r_code::Utils::GetGroupResilience(local_38,local_40,(double)uVar2);
    r_code::Atom::Float((float)lVar3);
    r_code::Atom::operator=((Atom *)&(this_01->super_View).field_0x38,local_54);
    r_code::Atom::~Atom(local_54);
    this_02 = (_Mem *)r_code::Mem::Get();
    _Mem::inject(this_02,this_01);
    start = (uint64_t)((int)uVar4 + 1);
  }
  return;
}

Assistant:

inline void AutoFocusController::inject_input(View *input, uint64_t start)
{
    Group *origin = input->get_host();

    for (uint16_t i = start; i < output_groups.size(); ++i) {
        Group *output_group = output_groups[i];
        View *view = new View(input, true);
        view->references[0] = output_group;
        view->code(VIEW_RES) = Atom::Float(Utils::GetGroupResilience(view->code(VIEW_RES).asFloat(), origin->get_upr(), output_group->get_upr()));
        _Mem::Get()->inject(view);
    }
}